

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

Abc_Ntk_t * Abc_SclBufferPhase(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pFanin;
  uint uVar4;
  void *__s;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  int local_44;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBuffer.c"
                  ,0xcd,"Abc_Ntk_t *Abc_SclBufferPhase(Abc_Ntk_t *, int)");
  }
  iVar1 = pNtk->vObjs->nSize;
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  if (iVar8 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar8 << 2);
    in_EDX = extraout_EDX;
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
    in_EDX = extraout_EDX_00;
  }
  pVVar5 = pNtk->vObjs;
  if (pVVar5->nSize < 1) {
    dVar11 = 0.0;
    local_44 = 0;
    dVar12 = 0.0;
  }
  else {
    lVar9 = 0;
    in_EDX = 0;
    iVar8 = 0;
    local_44 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar5->pArray[lVar9];
      if (((pObj != (Abc_Obj_t *)0x0) && (uVar4 = *(uint *)&pObj->field_0x14 & 0xf, uVar4 < 8)) &&
         ((0x98U >> uVar4 & 1) != 0)) {
        if (iVar1 <= lVar9) break;
        if (0 < (pObj->vFanins).nSize) {
          lVar10 = 0;
          do {
            pVVar3 = pObj->pNtk->vPhases;
            if (pVVar3 == (Vec_Int_t *)0x0) {
              __assert_fail("p->pNtk->vPhases",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                            ,0x18a,"int Abc_ObjFaninPhase(Abc_Obj_t *, int)");
            }
            iVar2 = pObj->Id;
            if (((long)iVar2 < 0) || (pVVar3->nSize <= iVar2)) goto LAB_00457f02;
            if (((uint)pVVar3->pArray[iVar2] >> ((uint)lVar10 & 0x1f) & 1) != 0) {
              pFanin = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar10]];
              iVar2 = pFanin->Id;
              if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_00457f02:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if ((*(int *)((long)__s + (long)iVar2 * 4) == 0) ||
                 ((uVar4 = *(uint *)&pFanin->field_0x14 & 0xf, uVar4 == 5 || (uVar4 == 2)))) {
                pAVar6 = Abc_NtkCreateNodeInv(pNtk,pFanin);
                iVar2 = pFanin->Id;
                if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                *(int *)((long)__s + (long)iVar2 * 4) = pAVar6->Id;
                local_44 = local_44 + 1;
              }
              iVar2 = pFanin->Id;
              if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_00457f02;
              iVar2 = *(int *)((long)__s + (long)iVar2 * 4);
              if (((long)iVar2 < 0) || (pNtk->vObjs->nSize <= iVar2)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              Abc_ObjPatchFanin(pObj,pFanin,(Abc_Obj_t *)pNtk->vObjs->pArray[iVar2]);
              iVar8 = iVar8 + 1;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < (pObj->vFanins).nSize);
          in_EDX = in_EDX + (int)lVar10;
        }
      }
      lVar9 = lVar9 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar9 < pVVar5->nSize);
    dVar12 = (double)in_EDX;
    dVar11 = (double)iVar8 * 100.0;
  }
  if (fVerbose != 0) {
    printf("Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n",
           ((double)local_44 * 100.0) / dVar12,dVar11 / dVar12);
    in_EDX = extraout_EDX_01;
  }
  if (__s != (void *)0x0) {
    free(__s);
    in_EDX = extraout_EDX_02;
  }
  Vec_IntFillExtra(pNtk->vPhases,pNtk->vObjs->nSize,in_EDX);
  pVVar3 = pNtk->vPhases;
  pNtk->vPhases = (Vec_Int_t *)0x0;
  pAVar7 = Abc_NtkDupDfs(pNtk);
  pNtk->vPhases = pVVar3;
  return pAVar7;
}

Assistant:

Abc_Ntk_t * Abc_SclBufferPhase( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vInvs;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int nNodesOld = Abc_NtkObjNumMax(pNtk);
    int i, k, Counter = 0, Counter2 = 0, Total = 0;
    assert( pNtk->vPhases != NULL );
    vInvs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            Total++;
            if ( !Abc_ObjFaninPhase(pObj, k) )
                continue;
            if ( Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) == 0 || Abc_ObjIsCi(pFanin) ) // allow PIs to have high fanout - to be fixed later
            {
                pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFanin );
                Vec_IntWriteEntry( vInvs, Abc_ObjId(pFanin), Abc_ObjId(pFaninNew) );
                Counter++;
            }
            pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) );
            Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
            Counter2++;
        }
    }
    if ( fVerbose )
        printf( "Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n", 
            Counter, 100.0 * Counter / Total, 100.0 * Counter2 / Total );
    Vec_IntFree( vInvs );
    Vec_IntFillExtra( pNtk->vPhases, Abc_NtkObjNumMax(pNtk), 0 );
    // duplicate network in topo order
    vInvs = pNtk->vPhases;
    pNtk->vPhases = NULL;
    pNtkNew = Abc_NtkDupDfs( pNtk );
    pNtk->vPhases = vInvs;
    return pNtkNew;
}